

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_1::AssertionPrinter::printRemainingMessages(AssertionPrinter *this,Code colour)

{
  bool bVar1;
  Code _colourCode;
  size_t count;
  ostream *poVar2;
  pointer pMVar3;
  Colour local_a2;
  allocator local_a1;
  undefined1 local_a0 [6];
  Colour colourGuard_1;
  pluralise local_80;
  Colour local_41;
  const_iterator cStack_40;
  Colour colourGuard;
  size_t N;
  const_iterator itEnd;
  Code colour_local;
  AssertionPrinter *this_local;
  
  itEnd._M_current =
       (MessageInfo *)
       std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end(&this->messages);
  bVar1 = __gnu_cxx::operator==
                    (&this->itMessage,
                     (__normal_iterator<Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                      *)&itEnd);
  if (!bVar1) {
    cStack_40 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::cend
                          (&this->messages);
    N = (size_t)cStack_40;
    count = std::
            distance<__gnu_cxx::__normal_iterator<Catch::MessageInfo_const*,std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>>>
                      ((this->itMessage)._M_current,
                       (__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                        )cStack_40._M_current);
    Colour::Colour(&local_41,colour);
    poVar2 = std::operator<<(this->stream," with ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_a0,"message",&local_a1);
    pluralise::pluralise(&local_80,count,(string *)local_a0);
    poVar2 = Catch::operator<<(poVar2,&local_80);
    std::operator<<(poVar2,':');
    pluralise::~pluralise(&local_80);
    std::__cxx11::string::~string((string *)local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    Colour::~Colour(&local_41);
    while (bVar1 = __gnu_cxx::operator!=
                             (&this->itMessage,
                              (__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                               *)&N), bVar1) {
      if (((this->printInfoMessages & 1U) == 0) &&
         (pMVar3 = __gnu_cxx::
                   __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                   ::operator->(&this->itMessage), pMVar3->type == Info)) {
        __gnu_cxx::
        __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
        ::operator++(&this->itMessage);
      }
      else {
        printMessage(this);
        bVar1 = __gnu_cxx::operator!=
                          (&this->itMessage,
                           (__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                            *)&N);
        if (bVar1) {
          _colourCode = anon_unknown.dwarf_c360c::dimColour();
          Colour::Colour(&local_a2,_colourCode);
          std::operator<<(this->stream," and");
          Colour::~Colour(&local_a2);
        }
      }
    }
  }
  return;
}

Assistant:

void printRemainingMessages(Colour::Code colour = dimColour()) {
        if (itMessage == messages.end())
            return;

        const auto itEnd = messages.cend();
        const auto N = static_cast<std::size_t>(std::distance(itMessage, itEnd));

        {
            Colour colourGuard(colour);
            stream << " with " << pluralise(N, "message") << ':';
        }

        while (itMessage != itEnd) {
            // If this assertion is a warning ignore any INFO messages
            if (printInfoMessages || itMessage->type != ResultWas::Info) {
                printMessage();
                if (itMessage != itEnd) {
                    Colour colourGuard(dimColour());
                    stream << " and";
                }
                continue;
            }
            ++itMessage;
        }
    }